

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDLFileData.h
# Opt level: O2

void __thiscall
Assimp::MDL::IntSplitGroupData_MDL7::~IntSplitGroupData_MDL7(IntSplitGroupData_MDL7 *this)

{
  vector<unsigned_int,_std::allocator<unsigned_int>_> **ppvVar1;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  uint uVar2;
  
  if (this->aiSplit != (vector<unsigned_int,_std::allocator<unsigned_int>_> **)0x0) {
    uVar2 = 0;
    while( true ) {
      ppvVar1 = this->aiSplit;
      if ((ulong)((long)(this->shared->pcMats).
                        super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)(this->shared->pcMats).
                        super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
                        super__Vector_impl_data._M_start >> 3) <= (ulong)uVar2) break;
      this_00 = &ppvVar1[uVar2]->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>;
      if (this_00 != (_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
        std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(this_00);
      }
      operator_delete(this_00);
      uVar2 = uVar2 + 1;
    }
    if (ppvVar1 != (vector<unsigned_int,_std::allocator<unsigned_int>_> **)0x0) {
      operator_delete__(ppvVar1);
      return;
    }
  }
  return;
}

Assistant:

~IntSplitGroupData_MDL7()
    {
        // kill all face lists
        if(this->aiSplit)
        {
            for (unsigned int m = 0; m < shared.pcMats.size();++m)
                delete this->aiSplit[m];
            delete[] this->aiSplit;
        }
    }